

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::
choose<__gnu_cxx::__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject**,std::vector<vkt::memory::(anonymous_namespace)::MemoryObject*,std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject*>>>,vkt::memory::(anonymous_namespace)::MemoryObject**>
          (Random *this,
          __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
          first,__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                last,MemoryObject_conflict **result,int numItems)

{
  bool bVar1;
  int iVar2;
  reference ppMVar3;
  int local_30;
  int r;
  int ndx;
  int numItems_local;
  MemoryObject_conflict **result_local;
  Random *this_local;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  last_local;
  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
  first_local;
  
  local_30 = 0;
  this_local = (Random *)last._M_current;
  last_local._M_current = first._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&last_local,
                            (__normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                             *)&this_local), bVar1) {
    if (local_30 < numItems) {
      ppMVar3 = __gnu_cxx::
                __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                ::operator*(&last_local);
      result[local_30] = *ppMVar3;
    }
    else {
      iVar2 = getInt(this,0,local_30);
      if (iVar2 < numItems) {
        ppMVar3 = __gnu_cxx::
                  __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
                  ::operator*(&last_local);
        result[iVar2] = *ppMVar3;
      }
    }
    __gnu_cxx::
    __normal_iterator<vkt::memory::(anonymous_namespace)::MemoryObject_**,_std::vector<vkt::memory::(anonymous_namespace)::MemoryObject_*,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject_*>_>_>
    ::operator++(&last_local);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}